

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly.h
# Opt level: O2

int __thiscall poly::degree(poly *this)

{
  int iVar1;
  int iVar2;
  
  if (-1 < this->_degree) {
    return this->_degree;
  }
  iVar1 = (*(int *)&(this->x).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
           *(int *)&(this->x).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start & 0x1ffffffcU) << 3;
  do {
    iVar2 = iVar1 + -1;
    this->_degree = iVar2;
    if (iVar1 < 2) {
      return iVar2;
    }
    iVar2 = operator[](this,iVar2);
    iVar1 = this->_degree;
  } while (iVar2 == 0);
  return iVar1;
}

Assistant:

int degree() const {
        if (_degree >= 0)
            return _degree;
        _degree = bits();
        do {
            _degree--;
        } while ((_degree > 0) && ((*this)[_degree] == 0));
        return _degree;
    }